

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGccDepfileLexer.cxx
# Opt level: O1

int cmGccDepfile_yylex_init_extra(cmGccDepfileLexerHelper *yy_user_defined,yyscan_t *ptr_yy_globals)

{
  undefined8 *__s;
  int *piVar1;
  yyguts_t_conflict1 *yyg;
  
  if (ptr_yy_globals == (yyscan_t *)0x0) {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
  }
  else {
    __s = (undefined8 *)malloc(0x98);
    *ptr_yy_globals = __s;
    if (__s != (undefined8 *)0x0) {
      memset(__s,0,0x98);
      *__s = yy_user_defined;
      *(undefined8 *)((long)__s + 0x5c) = 0;
      __s[0xd] = 0;
      __s[1] = 0;
      __s[2] = 0;
      __s[3] = 0;
      __s[4] = 0;
      __s[5] = 0;
      __s[9] = 0;
      __s[10] = 0;
      return 0;
    }
    piVar1 = __errno_location();
    *piVar1 = 0xc;
  }
  return 1;
}

Assistant:

int yylex_init_extra( YY_EXTRA_TYPE yy_user_defined, yyscan_t* ptr_yy_globals )
{
    struct yyguts_t dummy_yyguts;

    yyset_extra (yy_user_defined, &dummy_yyguts);

    if (ptr_yy_globals == NULL){
        errno = EINVAL;
        return 1;
    }

    *ptr_yy_globals = (yyscan_t) yyalloc ( sizeof( struct yyguts_t ), &dummy_yyguts );

    if (*ptr_yy_globals == NULL){
        errno = ENOMEM;
        return 1;
    }

    /* By setting to 0xAA, we expose bugs in
    yy_init_globals. Leave at 0x00 for releases. */
    memset(*ptr_yy_globals,0x00,sizeof(struct yyguts_t));

    yyset_extra (yy_user_defined, *ptr_yy_globals);

    return yy_init_globals ( *ptr_yy_globals );
}